

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::operator==
          (Minefield_Response_NACK_PDU *this,Minefield_Response_NACK_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Minefield_Response_NACK_PDU *Value_local;
  Minefield_Response_NACK_PDU *this_local;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui8ReqID == Value->m_ui8ReqID) {
      if (this->m_ui8NumMisPdus == Value->m_ui8NumMisPdus) {
        bVar2 = std::operator!=(&this->m_vSeqNums,&Value->m_vSeqNums);
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Minefield_Response_NACK_PDU::operator == ( const Minefield_Response_NACK_PDU & Value ) const
{
    if( Minefield_Header::operator != ( Value ) )             return false;
    if( m_ReqID                    != Value.m_ReqID )         return false;
    if( m_ui8ReqID                 != Value.m_ui8ReqID )      return false;
    if( m_ui8NumMisPdus            != Value.m_ui8NumMisPdus ) return false;
    if( m_vSeqNums                 != Value.m_vSeqNums )      return false;
    return true;
}